

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlHandle __thiscall TiXmlHandle::ChildElement(TiXmlHandle *this,int count)

{
  int in_EDX;
  undefined4 in_register_00000034;
  TiXmlElement *local_28;
  TiXmlElement *child;
  int i;
  int count_local;
  TiXmlHandle *this_local;
  
  if (*(long *)CONCAT44(in_register_00000034,count) != 0) {
    local_28 = TiXmlNode::FirstChildElement(*(TiXmlNode **)CONCAT44(in_register_00000034,count));
    for (child._0_4_ = 0; local_28 != (TiXmlElement *)0x0 && (int)child < in_EDX;
        child._0_4_ = (int)child + 1) {
      local_28 = TiXmlNode::NextSiblingElement(&local_28->super_TiXmlNode);
    }
    if (local_28 != (TiXmlElement *)0x0) {
      TiXmlHandle(this,&local_28->super_TiXmlNode);
      return (TiXmlHandle)(TiXmlNode *)this;
    }
  }
  TiXmlHandle(this,(TiXmlNode *)0x0);
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::ChildElement( int count ) const
{
	if ( node )
	{
		int i;
		TiXmlElement* child = node->FirstChildElement();
		for (	i=0;
				child && i<count;
				child = child->NextSiblingElement(), ++i )
		{
			// nothing
		}
		if ( child )
			return TiXmlHandle( child );
	}
	return TiXmlHandle( 0 );
}